

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator1D_imexmri.c
# Opt level: O1

int ReactionJac(sunrealtype c,N_Vector y,SUNMatrix Jac,UserData udata)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  double dVar10;
  int iVar11;
  int extraout_EAX;
  long lVar12;
  long lVar13;
  long lVar14;
  
  lVar14 = udata->N;
  dVar3 = udata->ep;
  lVar12 = N_VGetArrayPointer();
  iVar11 = (int)lVar12;
  if (lVar12 == 0) {
    ReactionJac_cold_1();
    iVar11 = extraout_EAX;
  }
  else if (2 < lVar14) {
    lVar7 = *(long *)((long)Jac->content + 0x28);
    lVar8 = *(long *)((long)Jac->content + 0x40);
    lVar14 = lVar14 + -2;
    lVar13 = 0x28;
    do {
      dVar4 = *(double *)(lVar12 + -0x10 + lVar13);
      dVar5 = *(double *)(lVar12 + lVar13);
      lVar9 = *(long *)(lVar8 + -0x10 + lVar13);
      dVar6 = *(double *)(lVar12 + -8 + lVar13);
      pdVar1 = (double *)(lVar9 + lVar7 * 8);
      dVar10 = pdVar1[1];
      pdVar2 = (double *)(lVar9 + lVar7 * 8);
      *pdVar2 = *pdVar1 + -(dVar5 + 1.0) + dVar6 * (dVar4 + dVar4);
      pdVar2[1] = dVar10 + dVar5 + dVar6 * -(dVar4 + dVar4);
      *(double *)(lVar9 + 0x10 + lVar7 * 8) = *(double *)(lVar9 + 0x10 + lVar7 * 8) - dVar5;
      lVar9 = *(long *)(lVar8 + -8 + lVar13);
      *(double *)(lVar9 + -8 + lVar7 * 8) = *(double *)(lVar9 + -8 + lVar7 * 8) + dVar4 * dVar4;
      *(double *)(lVar9 + lVar7 * 8) = *(double *)(lVar9 + lVar7 * 8) - dVar4 * dVar4;
      lVar9 = *(long *)(lVar8 + lVar13);
      *(double *)(lVar9 + -0x10 + lVar7 * 8) = *(double *)(lVar9 + -0x10 + lVar7 * 8) - dVar4;
      pdVar1 = (double *)(lVar9 + -8 + lVar7 * 8);
      dVar5 = pdVar1[1];
      pdVar2 = (double *)(lVar9 + -8 + lVar7 * 8);
      *pdVar2 = dVar4 + *pdVar1;
      pdVar2[1] = (-1.0 / dVar3 - dVar4) + dVar5;
      lVar13 = lVar13 + 0x18;
      lVar14 = lVar14 + -1;
    } while (lVar14 != 0);
  }
  return iVar11;
}

Assistant:

static int ReactionJac(sunrealtype c, N_Vector y, SUNMatrix Jac, UserData udata)
{
  sunindextype N = udata->N; /* set shortcuts */
  sunrealtype ep = udata->ep;
  sunindextype i;
  sunrealtype u, v, w;
  sunrealtype* Ydata = N_VGetArrayPointer(y); /* access solution array */
  if (check_retval((void*)Ydata, "N_VGetArrayPointer", 0)) { return 1; }

  /* iterate over nodes, filling in Jacobian of reaction terms */
  for (i = 1; i < N - 1; i++)
  {
    u = Ydata[IDX(i, 0)]; /* set nodal value shortcuts */
    v = Ydata[IDX(i, 1)];
    w = Ydata[IDX(i, 2)];

    /* all vars wrt u */
    SM_ELEMENT_B(Jac, IDX(i, 0), IDX(i, 0)) += c * (TWO * u * v - (w + ONE));
    SM_ELEMENT_B(Jac, IDX(i, 1), IDX(i, 0)) += c * (w - TWO * u * v);
    SM_ELEMENT_B(Jac, IDX(i, 2), IDX(i, 0)) += c * (-w);

    /* all vars wrt v */
    SM_ELEMENT_B(Jac, IDX(i, 0), IDX(i, 1)) += c * (u * u);
    SM_ELEMENT_B(Jac, IDX(i, 1), IDX(i, 1)) += c * (-u * u);

    /* all vars wrt w */
    SM_ELEMENT_B(Jac, IDX(i, 0), IDX(i, 2)) += c * (-u);
    SM_ELEMENT_B(Jac, IDX(i, 1), IDX(i, 2)) += c * (u);
    SM_ELEMENT_B(Jac, IDX(i, 2), IDX(i, 2)) += c * (-ONE / ep - u);
  }

  /* Return with success */
  return 0;
}